

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O3

bool __thiscall cmCTestHandlerCommand::CheckArgumentKeyword(cmCTestHandlerCommand *this,string *arg)

{
  int iVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  ulong uVar4;
  
  iVar1 = std::__cxx11::string::compare((char *)arg);
  if (iVar1 == 0) {
    this->ArgumentDoing = 0;
    this->AppendXML = true;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 != 0) {
      ppcVar2 = (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar3 = (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar4 = 0;
      if (ppcVar3 != ppcVar2) {
        do {
          if (ppcVar2[uVar4] != (char *)0x0) {
            iVar1 = std::__cxx11::string::compare((char *)arg);
            if (iVar1 == 0) {
              this->ArgumentDoing = 2;
              this->ArgumentIndex = (uint)uVar4;
              goto LAB_002e68fe;
            }
            ppcVar2 = (this->Arguments).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppcVar3 = (this->Arguments).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar4 = (ulong)((uint)uVar4 + 1);
        } while (uVar4 < (ulong)((long)ppcVar3 - (long)ppcVar2 >> 3));
        uVar4 = 0;
      }
      goto LAB_002e6901;
    }
    this->ArgumentDoing = 0;
    this->Quiet = true;
  }
LAB_002e68fe:
  uVar4 = 1;
LAB_002e6901:
  return SUB81(uVar4,0);
}

Assistant:

bool cmCTestHandlerCommand::CheckArgumentKeyword(std::string const& arg)
{
  // Look for non-value arguments common to all commands.
  if(arg == "APPEND")
    {
    this->ArgumentDoing = ArgumentDoingNone;
    this->AppendXML = true;
    return true;
    }
  if(arg == "QUIET")
    {
    this->ArgumentDoing = ArgumentDoingNone;
    this->Quiet = true;
    return true;
    }

  // Check for a keyword in our argument/value table.
  for(unsigned int k=0; k < this->Arguments.size(); ++k)
    {
    if(this->Arguments[k] && arg == this->Arguments[k])
      {
      this->ArgumentDoing = ArgumentDoingKeyword;
      this->ArgumentIndex = k;
      return true;
      }
    }
  return false;
}